

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::PatchPutValueCantChangeType<Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicObject *pDVar2;
  Type *pTVar3;
  
  bVar1 = VarIs<Js::DynamicObject>(instance);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    pTVar3 = (pDVar2->super_RecyclableObject).type.ptr;
  }
  else {
    pTVar3 = (Type *)0x0;
  }
  PatchPutValueWithThisPtr<true,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags);
  if (pTVar3 == (Type *)0x0) {
    bVar1 = false;
  }
  else {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    bVar1 = pTVar3 != (pDVar2->super_RecyclableObject).type.ptr;
  }
  return bVar1;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueCantChangeType, Op_PatchPutValue);

        Type * oldType = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetType() : nullptr;
        PatchPutValueWithThisPtr<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, instance, flags);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(instance)->GetType());

        JIT_HELPER_END(Op_PatchPutValueCantChangeType);
    }